

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void fullsize_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  byte bVar1;
  JDIMENSION JVar2;
  JSAMPROW pJVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  JVar2 = compptr->width_in_blocks;
  expand_right_edge(input_data + -1,cinfo->max_v_samp_factor + 2,cinfo->image_width,JVar2 * 8);
  iVar7 = cinfo->smoothing_factor * -0x200 + 0x10000;
  iVar8 = cinfo->smoothing_factor * 0x40;
  lVar11 = 0;
  while (lVar11 < compptr->v_samp_factor) {
    pJVar3 = output_data[lVar11];
    pbVar4 = input_data[lVar11 + -1];
    pbVar5 = input_data[lVar11];
    pbVar6 = input_data[lVar11 + 1];
    lVar11 = lVar11 + 1;
    bVar1 = *pbVar5;
    iVar12 = (uint)*pbVar6 + (uint)*pbVar4 + (uint)bVar1;
    iVar9 = (uint)pbVar5[1] + (uint)pbVar6[1] + (uint)pbVar4[1];
    *pJVar3 = (JSAMPLE)(iVar8 * ((iVar12 * 2 - (uint)bVar1) + iVar9) + (uint)bVar1 * iVar7 + 0x8000
                       >> 0x10);
    for (lVar13 = 0; (JVar2 * 8 - 8 | 6) != (uint)lVar13; lVar13 = lVar13 + 1) {
      iVar10 = (uint)pbVar5[lVar13 + 2] + (uint)pbVar6[lVar13 + 2] + (uint)pbVar4[lVar13 + 2];
      pJVar3[lVar13 + 1] =
           (JSAMPLE)((uint)pbVar5[lVar13 + 1] * iVar7 +
                     iVar8 * (((iVar12 + iVar9) - (uint)pbVar5[lVar13 + 1]) + iVar10) + 0x8000 >>
                    0x10);
      iVar12 = iVar9;
      iVar9 = iVar10;
    }
    pJVar3[lVar13 + 1] =
         (JSAMPLE)((uint)pbVar5[lVar13 + 1] * iVar7 +
                   iVar8 * ((iVar12 + iVar9 * 2) - (uint)pbVar5[lVar13 + 1]) + 0x8000 >> 0x10);
  }
  return;
}

Assistant:

METHODDEF(void)
fullsize_smooth_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                           JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int outrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr, above_ptr, below_ptr, outptr;
  JLONG membersum, neighsum, memberscale, neighscale;
  int colsum, lastcolsum, nextcolsum;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
                    cinfo->image_width, output_cols);

  /* Each of the eight neighbor pixels contributes a fraction SF to the
   * smoothed pixel, while the main pixel contributes (1-8*SF).  In order
   * to use integer arithmetic, these factors are multiplied by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 65536L - cinfo->smoothing_factor * 512L; /* scaled 1-8*SF */
  neighscale = cinfo->smoothing_factor * 64; /* scaled SF */

  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr = input_data[outrow];
    above_ptr = input_data[outrow - 1];
    below_ptr = input_data[outrow + 1];

    /* Special case for first column */
    colsum = (*above_ptr++) + (*below_ptr++) + inptr[0];
    membersum = *inptr++;
    nextcolsum = above_ptr[0] + below_ptr[0] + inptr[0];
    neighsum = colsum + (colsum - membersum) + nextcolsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
    lastcolsum = colsum;  colsum = nextcolsum;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      membersum = *inptr++;
      above_ptr++;  below_ptr++;
      nextcolsum = above_ptr[0] + below_ptr[0] + inptr[0];
      neighsum = lastcolsum + (colsum - membersum) + nextcolsum;
      membersum = membersum * memberscale + neighsum * neighscale;
      *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
      lastcolsum = colsum;  colsum = nextcolsum;
    }

    /* Special case for last column */
    membersum = *inptr;
    neighsum = lastcolsum + (colsum - membersum) + colsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE)((membersum + 32768) >> 16);

  }
}